

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llstk.c
# Opt level: O3

int quick_stack_check(void)

{
  ushort *puVar1;
  DLword DVar2;
  ushort uVar3;
  ushort uVar4;
  bool bVar5;
  DLword *pDVar6;
  ulong uVar7;
  DLword *pDVar8;
  char *s;
  ushort *puVar9;
  ushort *puVar10;
  DLword local_3a;
  undefined2 local_38;
  undefined2 local_36;
  
  DVar2 = MachineState.pvar[-5];
  uVar7 = (long)MachineState.csp - (long)Stackspace >> 1;
  if (0xffff < uVar7) {
    printf("Stack offset is out of range: 0x%tx\n",uVar7);
  }
  if ((DVar2 == (DLword)uVar7) && (MachineState.csp[1] == 0xa000)) {
    bVar5 = true;
  }
  else {
    if (MachineState.csp <= MachineState.pvar + -10) {
      warn("CURRENTFX >= CurrentStackPTR??\n");
      pDVar8 = MachineState.pvar + -10;
      if (((ulong)pDVar8 & 1) != 0) {
        printf("Misaligned pointer in LAddrFromNative %p\n",pDVar8);
      }
      pDVar6 = MachineState.csp;
      uVar7 = (long)pDVar8 - (long)Lisp_world;
      if (((ulong)MachineState.csp & 1) != 0) {
        printf("Misaligned pointer in LAddrFromNative %p\n",MachineState.csp);
      }
      printf("CURRENTFX=0x%x,CurrentStackPTR=0x%x\n",uVar7 >> 1 & 0xffffffff,
             (ulong)((long)pDVar6 - (long)Lisp_world) >> 1 & 0xffffffff);
      return 1;
    }
    local_3a = MachineState.pvar[-5];
    local_36 = *(undefined2 *)((ulong)(MachineState.csp + 2) ^ 2);
    local_38 = *(undefined2 *)((ulong)(MachineState.csp + 3) ^ 2);
    uVar7 = (long)(MachineState.csp + 2) - (long)Stackspace >> 1;
    if (0xffff < uVar7) {
      printf("Stack offset is out of range: 0x%tx\n",uVar7);
    }
    MachineState.pvar[-5] = (DLword)uVar7;
    *(undefined2 *)((ulong)(MachineState.csp + 2) ^ 2) = 0xa000;
    *(short *)((ulong)(MachineState.csp + 3) ^ 2) =
         (short)(((int)MachineState.endofstack - (int)MachineState.csp) - 4U >> 1);
    bVar5 = false;
  }
  pDVar8 = Stackspace;
  uVar3 = InterfacePage->stackbase;
  uVar4 = InterfacePage->endofstack;
  puVar1 = Stackspace + uVar4;
  if (*(ushort *)((ulong)puVar1 ^ 2) < 0xe000) {
    puts("?? endstack is not GUARD BLK");
  }
  if (uVar3 < uVar4) {
    puVar10 = pDVar8 + uVar3;
    do {
      puVar9 = (ushort *)((ulong)puVar10 ^ 2);
      uVar3 = *puVar9;
      uVar4 = uVar3 >> 0xd;
      if (uVar4 == 5) {
        uVar7 = (ulong)*puVar10;
        if (uVar7 == 0) {
          s = "FSB freesize = 0!";
LAB_0012c734:
          warn(s);
          return 1;
        }
LAB_0012c50f:
        puVar10 = puVar10 + uVar7;
      }
      else {
        if (uVar4 != 6) {
          if (uVar4 != 7) {
            while (uVar3 < 0x2000) {
              puVar10 = puVar10 + 2;
              puVar9 = (ushort *)((ulong)puVar10 ^ 2);
              uVar3 = *puVar9;
            }
            warn("StackCheck:!=STK_NOTFLG");
            printf("content:0x%x\n",(ulong)*puVar9);
            return 1;
          }
          uVar7 = (ulong)*puVar10;
          if (uVar7 == 0) {
            s = "Guard block freesize = 0!";
            goto LAB_0012c734;
          }
          goto LAB_0012c50f;
        }
        puVar10 = (ushort *)((ulong)((uint)puVar10[5] * 2) + (long)Stackspace);
      }
      if (puVar1 < puVar10) {
        warn("scanptr exceeded end stack");
        printf("scanptr68k=%p endstack68k=%p",puVar10,puVar1);
      }
    } while (puVar10 < puVar1);
  }
  if (!bVar5) {
    MachineState.pvar[-5] = local_3a;
    *(undefined2 *)((ulong)(MachineState.csp + 2) ^ 2) = local_36;
    *(undefined2 *)((ulong)(MachineState.csp + 3) ^ 2) = local_38;
    return 0;
  }
  return 0;
}

Assistant:

int quick_stack_check(void) {
  StackWord *start68k;
  StackWord *scanptr68k;
  StackWord *endstack68k;
  DLword *top_ivar;
  DLword save_nextblock;
  DLword savestack1, savestack2;
  DLword setflg = NIL;
  DLword freesize;

#ifdef FSBCHECK
  bigFSBindex = 0;
  memset((char *)bigFSB, 0, sizeof(bigFSB));
#endif

  if ((CURRENTFX->nextblock != StackOffsetFromNative(CurrentStackPTR)) || (!FSBP(CurrentStackPTR))) {
    if ((DLword *)CURRENTFX >= CurrentStackPTR) {
      WARN("CURRENTFX >= CurrentStackPTR??\n",
           printf("CURRENTFX=0x%x,CurrentStackPTR=0x%x\n", LAddrFromNative(CURRENTFX),
                  LAddrFromNative(CurrentStackPTR)));
      return(1);
    }
    setflg = T;
    save_nextblock = CURRENTFX->nextblock;
    savestack1 = GETWORD(CurrentStackPTR + 2);
    savestack2 = GETWORD(CurrentStackPTR + 3);
    CURRENTFX->nextblock = StackOffsetFromNative(CurrentStackPTR + 2);
    GETWORD(CurrentStackPTR + 2) = STK_FSB_WORD;
    GETWORD(CurrentStackPTR + 3) = (((UNSIGNED)EndSTKP - (UNSIGNED)(CurrentStackPTR + 2)) >> 1);
  }

  scanptr68k = start68k = (StackWord *)NativeAligned2FromStackOffset(InterfacePage->stackbase);
  endstack68k = (StackWord *)NativeAligned2FromStackOffset(InterfacePage->endofstack);

  if (STKWORD(endstack68k)->flags != STK_GUARD) printf("?? endstack is not GUARD BLK\n");

  while (scanptr68k < endstack68k) {
    switch ((unsigned)(STKWORD(scanptr68k)->flags)) {
      case STK_FSB:
        freesize = FSB_size(scanptr68k);
        if (freesize == 0) {
          warn("FSB freesize = 0!");
          return(1);
        }
#ifdef FSBCHECK
        if (freesize > STACKAREA_SIZE + MINEXTRASTACKWORDS) {
          if (bigFSBindex < 100) {
            bigFSB[bigFSBindex].offset = StackOffsetFromNative(scanptr68k);
            bigFSB[bigFSBindex].size = freesize;
            bigFSBindex++;
          }
        }
#endif
        scanptr68k = (StackWord *)((DLword *)scanptr68k + freesize);
        break;
      case STK_GUARD:
        freesize = FSB_size(scanptr68k);
        if (freesize == 0) {
          warn("Guard block freesize = 0!");
          return(1);
        }
        scanptr68k = (StackWord *)((DLword *)scanptr68k + freesize);
        break;
      case STK_FX:
        CHECK_FX((FX *)scanptr68k);
        scanptr68k = (StackWord *)NativeAligned2FromStackOffset(((FX *)scanptr68k)->nextblock);
        break;
      default:
        top_ivar = (DLword *)scanptr68k;
        while (STKWORD(scanptr68k)->flags != STK_BF) {
          if (STKWORD(scanptr68k)->flags != STK_NOTFLG) {
            warn("StackCheck:!=STK_NOTFLG");
            printf("content:0x%x\n", GETWORD((DLword *)scanptr68k));
            return(1);
          }
          scanptr68k = (StackWord *)((DLword *)scanptr68k + DLWORDSPER_CELL);
        } /* while end */
        CHECK_BF((Bframe *)scanptr68k);
        if (((Bframe *)scanptr68k)->residual) {
          if ((DLword *)scanptr68k != top_ivar)
            printf("Residual has real IVAR:0x%x\n", LAddrFromNative(scanptr68k));
        } else {
          if (((Bframe *)scanptr68k)->ivar != StackOffsetFromNative(top_ivar))
            printf("BF doesn't point TopIVAR:0x%x\n", LAddrFromNative(scanptr68k));
        }
        scanptr68k = (StackWord *)((DLword *)scanptr68k + DLWORDSPER_CELL);
        break;
    } /*switch end */
    if (scanptr68k != start68k) {
      if (scanptr68k > endstack68k) {
        WARN("scanptr exceeded end stack",
             printf("scanptr68k=%p endstack68k=%p", (void *)scanptr68k, (void *)endstack68k));
      }
    }
  } /* while end */
#ifdef FSBCHECK
  if (bigFSBindex != 0) {
    int i;

    printf("\nBIG FSB(s):\n");

    for (i = 0; i < bigFSBindex; i++) {
      printf("Offset: 0x%x , Size: 0x%x\n", bigFSB[i].offset, bigFSB[i].size);
    }
  }
#endif

  if (setflg) {
    CURRENTFX->nextblock = save_nextblock;
    GETWORD(CurrentStackPTR + 2) = savestack1;
    GETWORD(CurrentStackPTR + 3) = savestack2;
  }
  return(0);

}